

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

AMQP_MESSENGER_DISPOSITION_RESULT
on_amqp_message_received_callback
          (MESSAGE_HANDLE message,AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info,
          void *context)

{
  bool bVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LIST_ITEM_HANDLE item_handle;
  TWIN_OPERATION_CONTEXT *op_ctx;
  _Bool *has_twin_report_00;
  undefined4 uVar4;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  _Bool unsubscription_succeeded;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  _Bool subscription_succeeded;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  LOGGER_LOG l_2;
  LIST_ITEM_HANDLE list_item;
  LOGGER_LOG l_1;
  BINARY_DATA twin_report;
  _Bool has_twin_report;
  int64_t version;
  int local_50;
  _Bool has_version;
  int status_code;
  _Bool has_status_code;
  char *correlation_id;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  LOGGER_LOG l;
  void *pvStack_28;
  AMQP_MESSENGER_DISPOSITION_RESULT disposition_result;
  void *context_local;
  AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info_local;
  MESSAGE_HANDLE message_local;
  
  pvStack_28 = context;
  context_local = disposition_info;
  disposition_info_local = (AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *)message;
  if ((message == (MESSAGE_HANDLE)0x0) || (context == (void *)0x0)) {
    twin_msgr = (TWIN_MESSENGER_INSTANCE_conflict *)xlogging_get_log_function();
    if (twin_msgr != (TWIN_MESSENGER_INSTANCE_conflict *)0x0) {
      (*(code *)twin_msgr)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                 ,"on_amqp_message_received_callback",0x544,1,
                 "Invalid argument (message=%p, context=%p)",disposition_info_local,pvStack_28);
    }
    l._4_4_ = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
  }
  else {
    correlation_id = (char *)context;
    amqp_messenger_destroy_disposition_info(disposition_info);
    l._4_4_ = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    has_twin_report_00 = (_Bool *)((long)&twin_report.length + 7);
    iVar2 = parse_incoming_twin_message
                      ((MESSAGE_HANDLE)disposition_info_local,(char **)&status_code,
                       (_Bool *)((long)&version + 7),(int64_t *)&stack0xffffffffffffffa0,
                       &has_version,&local_50,has_twin_report_00,(BINARY_DATA *)&l_1);
    uVar4 = (undefined4)((ulong)has_twin_report_00 >> 0x20);
    if (iVar2 == 0) {
      if (_status_code == (char *)0x0) {
        if ((twin_report.length._7_1_ & 1) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"on_amqp_message_received_callback",0x615,1,
                      "Received TWIN message with no correlation-id and no report (%s)",
                      *(undefined8 *)(correlation_id + 0x10));
          }
        }
        else if (*(long *)(correlation_id + 0x60) != 0) {
          (**(code **)(correlation_id + 0x60))
                    (0,l_1,twin_report.bytes,*(undefined8 *)(correlation_id + 0x68));
        }
      }
      else {
        item_handle = singlylinkedlist_find
                                (*(SINGLYLINKEDLIST_HANDLE *)(correlation_id + 0x38),
                                 find_twin_operation_by_correlation_id,_status_code);
        if (item_handle == (LIST_ITEM_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"on_amqp_message_received_callback",0x566,1,
                      "Could not find context of TWIN incoming message (%s, %s)",
                      *(undefined8 *)(correlation_id + 0x10),_status_code);
          }
        }
        else {
          op_ctx = (TWIN_OPERATION_CONTEXT *)singlylinkedlist_item_get_value(item_handle);
          if (op_ctx == (TWIN_OPERATION_CONTEXT *)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x56e,1,
                        "Could not get context for incoming TWIN message (%s, %s)",
                        *(undefined8 *)(correlation_id + 0x10),_status_code);
            }
          }
          else {
            if (op_ctx->type == TWIN_OPERATION_TYPE_PATCH) {
              if ((has_version & 1U) == 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"on_amqp_message_received_callback",0x576,1,
                            "Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)"
                            ,*(undefined8 *)(correlation_id + 0x10),_status_code);
                }
                l._4_4_ = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
                if ((op_ctx->cb).reported_properties.callback !=
                    (TWIN_MESSENGER_REPORT_STATE_COMPLETE_CALLBACK)0x0) {
                  (*(op_ctx->cb).reported_properties.callback)
                            (TWIN_REPORT_STATE_RESULT_ERROR,
                             TWIN_REPORT_STATE_REASON_INVALID_RESPONSE,0,
                             (op_ctx->cb).reported_properties.context);
                }
              }
              else if ((op_ctx->cb).reported_properties.callback !=
                       (TWIN_MESSENGER_REPORT_STATE_COMPLETE_CALLBACK)0x0) {
                (*(op_ctx->cb).reported_properties.callback)
                          (TWIN_REPORT_STATE_RESULT_SUCCESS,TWIN_REPORT_STATE_REASON_NONE,local_50,
                           (op_ctx->cb).reported_properties.context);
              }
            }
            else if (op_ctx->type == TWIN_OPERATION_TYPE_GET) {
              if ((twin_report.length._7_1_ & 1) == 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"on_amqp_message_received_callback",0x58b,1,
                            "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                            ,*(undefined8 *)(correlation_id + 0x10),_status_code);
                }
                l._4_4_ = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
                if (op_ctx->msgr->on_message_received_callback != (TWIN_STATE_UPDATE_CALLBACK)0x0) {
                  (*op_ctx->msgr->on_message_received_callback)
                            (TWIN_UPDATE_TYPE_COMPLETE,(char *)0x0,0,
                             op_ctx->msgr->on_message_received_context);
                }
                if (*(int *)(correlation_id + 0x50) == 3) {
                  correlation_id[0x50] = '\x02';
                  correlation_id[0x51] = '\0';
                  correlation_id[0x52] = '\0';
                  correlation_id[0x53] = '\0';
                  *(long *)(correlation_id + 0x58) = *(long *)(correlation_id + 0x58) + 1;
                }
              }
              else {
                if (op_ctx->msgr->on_message_received_callback != (TWIN_STATE_UPDATE_CALLBACK)0x0) {
                  (*op_ctx->msgr->on_message_received_callback)
                            (TWIN_UPDATE_TYPE_COMPLETE,(char *)l_1,(size_t)twin_report.bytes,
                             op_ctx->msgr->on_message_received_context);
                }
                if (*(int *)(correlation_id + 0x50) == 3) {
                  correlation_id[0x50] = '\x04';
                  correlation_id[0x51] = '\0';
                  correlation_id[0x52] = '\0';
                  correlation_id[0x53] = '\0';
                  correlation_id[0x58] = '\0';
                  correlation_id[0x59] = '\0';
                  correlation_id[0x5a] = '\0';
                  correlation_id[0x5b] = '\0';
                  correlation_id[0x5c] = '\0';
                  correlation_id[0x5d] = '\0';
                  correlation_id[0x5e] = '\0';
                  correlation_id[0x5f] = '\0';
                }
              }
            }
            else if (op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND) {
              if ((twin_report.length._7_1_ & 1) == 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"on_amqp_message_received_callback",0x5ac,1,
                            "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                            ,*(undefined8 *)(correlation_id + 0x10),_status_code);
                }
                l._4_4_ = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
                (*(op_ctx->cb).reported_properties.callback)
                          (TWIN_REPORT_STATE_RESULT_ERROR,TWIN_REPORT_STATE_REASON_NONE,0,
                           (op_ctx->cb).reported_properties.context);
              }
              else {
                (*(op_ctx->cb).reported_properties.callback)
                          (TWIN_REPORT_STATE_RESULT_ERROR,(TWIN_REPORT_STATE_REASON)l_1,
                           (int)twin_report.bytes,(op_ctx->cb).reported_properties.context);
              }
            }
            else if (op_ctx->type == TWIN_OPERATION_TYPE_PUT) {
              if (*(int *)(correlation_id + 0x50) == 6) {
                bVar1 = true;
                if ((has_version & 1U) == 0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                              ,"on_amqp_message_received_callback",0x5bf,1,
                              "Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)"
                              ,*(undefined8 *)(correlation_id + 0x10),_status_code);
                  }
                  bVar1 = false;
                }
                else if ((local_50 < 200) || (299 < local_50)) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                              ,"on_amqp_message_received_callback",0x5c5,1,
                              "Received status code %d for TWIN subscription request (%s, %s)",
                              CONCAT44(uVar4,local_50),*(undefined8 *)(correlation_id + 0x10),
                              _status_code);
                  }
                  bVar1 = false;
                }
                if (*(int *)(correlation_id + 0x50) == 5) {
                  if (bVar1) {
                    correlation_id[0x50] = '\x06';
                    correlation_id[0x51] = '\0';
                    correlation_id[0x52] = '\0';
                    correlation_id[0x53] = '\0';
                    correlation_id[0x58] = '\0';
                    correlation_id[0x59] = '\0';
                    correlation_id[0x5a] = '\0';
                    correlation_id[0x5b] = '\0';
                    correlation_id[0x5c] = '\0';
                    correlation_id[0x5d] = '\0';
                    correlation_id[0x5e] = '\0';
                    correlation_id[0x5f] = '\0';
                  }
                  else {
                    correlation_id[0x50] = '\x04';
                    correlation_id[0x51] = '\0';
                    correlation_id[0x52] = '\0';
                    correlation_id[0x53] = '\0';
                    *(long *)(correlation_id + 0x58) = *(long *)(correlation_id + 0x58) + 1;
                  }
                }
              }
            }
            else if ((op_ctx->type == TWIN_OPERATION_TYPE_DELETE) &&
                    (*(int *)(correlation_id + 0x50) == 1)) {
              bVar1 = true;
              if ((has_version & 1U) == 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"on_amqp_message_received_callback",0x5e1,1,
                            "Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)"
                            ,*(undefined8 *)(correlation_id + 0x10),_status_code);
                }
                bVar1 = false;
              }
              else if ((local_50 < 200) || (299 < local_50)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"on_amqp_message_received_callback",0x5e7,1,
                            "Received status code %d for TWIN unsubscription request (%s, %s)",
                            CONCAT44(uVar4,local_50),*(undefined8 *)(correlation_id + 0x10),
                            _status_code);
                }
                bVar1 = false;
              }
              if (*(int *)(correlation_id + 0x50) == 8) {
                if (bVar1) {
                  correlation_id[0x50] = '\x01';
                  correlation_id[0x51] = '\0';
                  correlation_id[0x52] = '\0';
                  correlation_id[0x53] = '\0';
                  correlation_id[0x58] = '\0';
                  correlation_id[0x59] = '\0';
                  correlation_id[0x5a] = '\0';
                  correlation_id[0x5b] = '\0';
                  correlation_id[0x5c] = '\0';
                  correlation_id[0x5d] = '\0';
                  correlation_id[0x5e] = '\0';
                  correlation_id[0x5f] = '\0';
                }
                else {
                  correlation_id[0x50] = '\a';
                  correlation_id[0x51] = '\0';
                  correlation_id[0x52] = '\0';
                  correlation_id[0x53] = '\0';
                  *(long *)(correlation_id + 0x58) = *(long *)(correlation_id + 0x58) + 1;
                }
              }
            }
            destroy_twin_operation_context(op_ctx);
          }
          iVar2 = singlylinkedlist_remove
                            (*(SINGLYLINKEDLIST_HANDLE *)(correlation_id + 0x38),item_handle);
          if (iVar2 != 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x602,1,
                        "Failed removing context for incoming TWIN message (%s, %s)",
                        *(undefined8 *)(correlation_id + 0x10),_status_code);
            }
            update_state((TWIN_MESSENGER_INSTANCE_conflict *)correlation_id,
                         TWIN_MESSENGER_STATE_ERROR);
          }
        }
        free(_status_code);
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"on_amqp_message_received_callback",0x55b,1,
                  "Failed parsing incoming TWIN message (%s)",*(undefined8 *)(correlation_id + 0x10)
                 );
      }
    }
  }
  return l._4_4_;
}

Assistant:

static AMQP_MESSENGER_DISPOSITION_RESULT on_amqp_message_received_callback(MESSAGE_HANDLE message, AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO* disposition_info, void* context)
{

    AMQP_MESSENGER_DISPOSITION_RESULT disposition_result;

    if (message == NULL || context == NULL)
    {
        LogError("Invalid argument (message=%p, context=%p)", message, context);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)context;

        char* correlation_id;

        bool has_status_code;
        int status_code;

        bool has_version;
        int64_t version;

        bool has_twin_report;
        BINARY_DATA twin_report;

        amqp_messenger_destroy_disposition_info(disposition_info);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;

        if (parse_incoming_twin_message(message, &correlation_id, &has_version, &version, &has_status_code, &status_code, &has_twin_report, &twin_report) != 0)
        {
            LogError("Failed parsing incoming TWIN message (%s)", twin_msgr->device_id);
        }
        else
        {
            if (correlation_id != NULL)
            {
                // It is supposed to be a request sent previously (reported properties PATCH, GET, PUT or DELETE).

                LIST_ITEM_HANDLE list_item;
                if ((list_item = singlylinkedlist_find(twin_msgr->operations, find_twin_operation_by_correlation_id, (const void*)correlation_id)) == NULL)
                {
                    LogError("Could not find context of TWIN incoming message (%s, %s)", twin_msgr->device_id, correlation_id);
                }
                else
                {
                    TWIN_OPERATION_CONTEXT* twin_op_ctx;

                    if ((twin_op_ctx = (TWIN_OPERATION_CONTEXT*)singlylinkedlist_item_get_value(list_item)) == NULL)
                    {
                        LogError("Could not get context for incoming TWIN message (%s, %s)", twin_msgr->device_id, correlation_id);
                    }
                    else
                    {
                        if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
                        {
                            if (!has_status_code)
                            {
                                LogError("Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_ERROR, TWIN_REPORT_STATE_REASON_INVALID_RESPONSE, 0, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_SUCCESS, TWIN_REPORT_STATE_REASON_NONE, status_code, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                                    twin_msgr->subscription_error_count++;
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                    twin_msgr->subscription_error_count = 0;
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->cb.get_twin.context);
                            }
                            else
                            {
                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->cb.get_twin.context);
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBED)
                            {
                                bool subscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN subscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBING)
                                {
                                    if (subscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_DELETE)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED)
                            {
                                bool unsubscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN unsubscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING)
                                {
                                    if (unsubscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }

                        destroy_twin_operation_context(twin_op_ctx);
                    }

                    if (singlylinkedlist_remove(twin_msgr->operations, list_item) != 0)
                    {
                        LogError("Failed removing context for incoming TWIN message (%s, %s)",
                            twin_msgr->device_id, correlation_id);

                        update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
                    }
                }

                free(correlation_id);
            }
            else if (has_twin_report)
            {
                // It is supposed to be a desired properties delta update.

                if (twin_msgr->on_message_received_callback != NULL)
                {
                    twin_msgr->on_message_received_callback(TWIN_UPDATE_TYPE_PARTIAL, (const char*)twin_report.bytes, twin_report.length, twin_msgr->on_message_received_context);
                }
            }
            else
            {
                LogError("Received TWIN message with no correlation-id and no report (%s)", twin_msgr->device_id);
            }
        }
    }

    return disposition_result;
}